

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any.c++
# Opt level: O0

Equality __thiscall capnp::AnyPointer::Reader::equals(Reader *this,Reader right)

{
  Reader right_00;
  Reader right_01;
  PointerType PVar1;
  PointerType PVar2;
  ReaderFor<capnp::AnyList> local_d8;
  ReaderFor<capnp::AnyList> local_a8;
  ReaderFor<capnp::AnyStruct> local_78;
  ReaderFor<capnp::AnyStruct> local_48;
  Reader *local_18;
  Reader *this_local;
  
  local_18 = this;
  PVar1 = getPointerType(this);
  PVar2 = getPointerType(&right);
  if (PVar1 == PVar2) {
    PVar1 = getPointerType(this);
    switch(PVar1) {
    case NULL_:
      this_local._4_4_ = EQUAL;
      break;
    case STRUCT:
      getAs<capnp::AnyStruct>(&local_48,this);
      getAs<capnp::AnyStruct>(&local_78,&right);
      right_00._reader.capTable = local_78._reader.capTable;
      right_00._reader.segment = local_78._reader.segment;
      right_00._reader.data = local_78._reader.data;
      right_00._reader.pointers = local_78._reader.pointers;
      right_00._reader.dataSize = local_78._reader.dataSize;
      right_00._reader.pointerCount = local_78._reader.pointerCount;
      right_00._reader._38_2_ = local_78._reader._38_2_;
      right_00._reader.nestingLimit = local_78._reader.nestingLimit;
      right_00._reader._44_4_ = local_78._reader._44_4_;
      this_local._4_4_ = AnyStruct::Reader::equals(&local_48,right_00);
      break;
    case LIST:
      getAs<capnp::AnyList>(&local_a8,this);
      getAs<capnp::AnyList>(&local_d8,&right);
      right_01._reader.capTable = local_d8._reader.capTable;
      right_01._reader.segment = local_d8._reader.segment;
      right_01._reader.ptr = local_d8._reader.ptr;
      right_01._reader.elementCount = local_d8._reader.elementCount;
      right_01._reader.step = local_d8._reader.step;
      right_01._reader.structDataSize = local_d8._reader.structDataSize;
      right_01._reader.structPointerCount = local_d8._reader.structPointerCount;
      right_01._reader.elementSize = local_d8._reader.elementSize;
      right_01._reader._39_1_ = local_d8._reader._39_1_;
      right_01._reader.nestingLimit = local_d8._reader.nestingLimit;
      right_01._reader._44_4_ = local_d8._reader._44_4_;
      this_local._4_4_ = AnyList::Reader::equals(&local_a8,right_01);
      break;
    case CAPABILITY:
      this_local._4_4_ = UNKNOWN_CONTAINS_CAPS;
      break;
    default:
      kj::_::unreachable();
    }
  }
  else {
    this_local._4_4_ = NOT_EQUAL;
  }
  return this_local._4_4_;
}

Assistant:

Equality AnyPointer::Reader::equals(AnyPointer::Reader right) const {
  if(getPointerType() != right.getPointerType()) {
    return Equality::NOT_EQUAL;
  }
  switch(getPointerType()) {
    case PointerType::NULL_:
      return Equality::EQUAL;
    case PointerType::STRUCT:
      return getAs<AnyStruct>().equals(right.getAs<AnyStruct>());
    case PointerType::LIST:
      return getAs<AnyList>().equals(right.getAs<AnyList>());
    case PointerType::CAPABILITY:
      return Equality::UNKNOWN_CONTAINS_CAPS;
  }
  // There aren't currently any other types of pointers
  KJ_UNREACHABLE;
}